

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_alt_helpers.cpp
# Opt level: O0

int mbedtls_rsa_validate_crt
              (mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *DP,mbedtls_mpi *DQ,
              mbedtls_mpi *QP)

{
  int iVar1;
  mbedtls_mpi *in_RCX;
  mbedtls_mpi *in_RDX;
  mbedtls_mpi *in_RSI;
  long in_RDI;
  long in_R8;
  mbedtls_mpi *in_R9;
  mbedtls_mpi L;
  mbedtls_mpi K;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffffa8;
  mbedtls_mpi *in_stack_ffffffffffffffb0;
  mbedtls_mpi *in_stack_ffffffffffffffb8;
  mbedtls_mpi *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  int iVar2;
  
  iVar2 = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffb8);
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffa8);
  if (in_RCX != (mbedtls_mpi *)0x0) {
    if (in_RDI == 0) {
      iVar2 = -0x4080;
      goto LAB_00883e55;
    }
    iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                                (mbedtls_mpi_sint)in_stack_ffffffffffffffc0);
    if (((iVar2 != 0) ||
        (iVar2 = mbedtls_mpi_sub_mpi(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                     (mbedtls_mpi *)0x883ca7), iVar2 != 0)) ||
       (iVar2 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffa8), iVar2 != 0)) goto LAB_00883e55;
    iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                (mbedtls_mpi_sint)in_stack_ffffffffffffffb8);
    if (iVar1 != 0) {
      iVar2 = -0x4200;
      goto LAB_00883e55;
    }
  }
  if (in_R8 != 0) {
    if (in_RSI == (mbedtls_mpi *)0x0) {
      iVar2 = -0x4080;
      goto LAB_00883e55;
    }
    iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                                (mbedtls_mpi_sint)in_stack_ffffffffffffffc0);
    if (((iVar2 != 0) ||
        (iVar2 = mbedtls_mpi_sub_mpi(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                     (mbedtls_mpi *)0x883d54), iVar2 != 0)) ||
       (iVar2 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                    in_stack_ffffffffffffffa8), iVar2 != 0)) goto LAB_00883e55;
    iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                (mbedtls_mpi_sint)in_stack_ffffffffffffffb8);
    if (iVar1 != 0) {
      iVar2 = -0x4200;
      goto LAB_00883e55;
    }
  }
  if (in_R9 != (mbedtls_mpi *)0x0) {
    if ((in_RDI == 0) || (in_RSI == (mbedtls_mpi *)0x0)) {
      iVar2 = -0x4080;
    }
    else {
      iVar2 = mbedtls_mpi_mul_mpi(in_RSI,in_RDX,in_RCX);
      if ((((iVar2 == 0) &&
           (iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffc8,
                                        (mbedtls_mpi_sint)in_stack_ffffffffffffffc0), iVar2 == 0))
          && (iVar2 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                          in_stack_ffffffffffffffa8), iVar2 == 0)) &&
         (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffffb8), iVar1 != 0)) {
        iVar2 = -0x4200;
      }
    }
  }
LAB_00883e55:
  if (((iVar2 != 0) && (iVar2 != -0x4200)) && (iVar2 != -0x4080)) {
    iVar2 = iVar2 + -0x4200;
  }
  mbedtls_mpi_free((mbedtls_mpi *)0x883e87);
  mbedtls_mpi_free((mbedtls_mpi *)0x883e8f);
  return iVar2;
}

Assistant:

int mbedtls_rsa_validate_crt(const mbedtls_mpi *P,  const mbedtls_mpi *Q,
                             const mbedtls_mpi *D,  const mbedtls_mpi *DP,
                             const mbedtls_mpi *DQ, const mbedtls_mpi *QP)
{
    int ret = 0;

    mbedtls_mpi K, L;
    mbedtls_mpi_init(&K);
    mbedtls_mpi_init(&L);

    /* Check that DP - D == 0 mod P - 1 */
    if (DP != NULL) {
        if (P == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, P, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&L, DP, D));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&L, &L, &K));

        if (mbedtls_mpi_cmp_int(&L, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that DQ - D == 0 mod Q - 1 */
    if (DQ != NULL) {
        if (Q == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, Q, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&L, DQ, D));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&L, &L, &K));

        if (mbedtls_mpi_cmp_int(&L, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that QP * Q - 1 == 0 mod P */
    if (QP != NULL) {
        if (P == NULL || Q == NULL) {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, QP, Q));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, &K, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&K, &K, P));
        if (mbedtls_mpi_cmp_int(&K, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

cleanup:

    /* Wrap MPI error codes by RSA check failure error code */
    if (ret != 0 &&
        ret != MBEDTLS_ERR_RSA_KEY_CHECK_FAILED &&
        ret != MBEDTLS_ERR_RSA_BAD_INPUT_DATA) {
        ret += MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    mbedtls_mpi_free(&K);
    mbedtls_mpi_free(&L);

    return ret;
}